

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

wchar_t * ON_Environment::StringFromProjection(BackgroundProjections proj)

{
  undefined8 in_RAX;
  undefined8 in_R9;
  
  if ((proj < (HorizontalCrossCubeMap|Emap)) && (in_RAX = 0x3ef, (0x3efU >> (proj & 0x1f) & 1) != 0)
     ) {
    return (wchar_t *)(&DAT_006cb800 + *(int *)(&DAT_006cb800 + (ulong)proj * 4));
  }
  ON_REMOVE_ASAP_AssertEx
            (0,
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_render_content.cpp"
             ,0xd5,"","false is false",in_R9,in_RAX);
  return L"planar";
}

Assistant:

const wchar_t* ON_Environment::StringFromProjection(BackgroundProjections proj) // Static.
{
  switch (proj)
  {
  case BackgroundProjections::Planar:                 return ON_ENVIRONMENT_PROJECTION_PLANAR;
  case BackgroundProjections::Spherical:              return ON_ENVIRONMENT_PROJECTION_SPHERICAL;
  case BackgroundProjections::Emap:                   return ON_ENVIRONMENT_PROJECTION_EMAP;
  case BackgroundProjections::Box:                    return ON_ENVIRONMENT_PROJECTION_BOX;
  case BackgroundProjections::LightProbe:             return ON_ENVIRONMENT_PROJECTION_LIGHT_PROBE;
  case BackgroundProjections::CubeMap:                return ON_ENVIRONMENT_PROJECTION_CUBE_MAP;
  case BackgroundProjections::VerticalCrossCubeMap:   return ON_ENVIRONMENT_PROJECTION_CUBE_MAP_VERT;
  case BackgroundProjections::HorizontalCrossCubeMap: return ON_ENVIRONMENT_PROJECTION_CUBE_MAP_HORZ;
  case BackgroundProjections::Hemispherical:          return ON_ENVIRONMENT_PROJECTION_HEMISPHERICAL;
  default: break;
  }

  ON_ASSERT(false);
  return ON_ENVIRONMENT_PROJECTION_PLANAR;
}